

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O2

void testYca(string *tempDir)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  Box2i *dw;
  int writeOrder;
  LineOrder writeOrder_00;
  int count;
  int readOrder;
  LineOrder readOrder_00;
  string fileName;
  Box2i local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing luminance/chroma input and output");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator+(&fileName,tempDir,"imf_test_yca.exr");
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&local_98.min.x + lVar5) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)&local_98.max.x + lVar5) = 0x8000000080000000;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x60);
  local_98.min.x = 0;
  local_98.min.y = 0;
  local_98.max.x = 1;
  local_98.max.y = 0x11;
  local_88 = 0;
  uStack_80 = 0x1100000005;
  local_78 = 0;
  uStack_70 = 0x100000011;
  local_68 = 0;
  uStack_60 = 0x500000011;
  local_58 = 0;
  uStack_50 = 0x100000001;
  local_48 = 0xffffffe4ffffffee;
  uStack_40 = 0xff000000f7;
  bVar1 = IlmThread_2_5::supportsThreads();
  for (count = 0; count != (uint)bVar1 + (uint)bVar1 * 2 + 1; count = count + 1) {
    cVar2 = IlmThread_2_5::supportsThreads();
    if (cVar2 != '\0') {
      Imf_2_5::setGlobalThreadCount(count);
      poVar4 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar3 = Imf_2_5::globalThreadCount();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
      dw = &local_98 + lVar5;
      for (writeOrder_00 = INCREASING_Y; writeOrder_00 != RANDOM_Y;
          writeOrder_00 = writeOrder_00 + DECREASING_Y) {
        for (readOrder_00 = INCREASING_Y; readOrder_00 != NUM_LINEORDERS;
            readOrder_00 = readOrder_00 + DECREASING_Y) {
          anon_unknown.dwarf_28912e::writeReadYca
                    (fileName._M_dataplus._M_p,dw,WRITE_YCA,writeOrder_00,readOrder_00,
                     anon_unknown.dwarf_28912e::fillPixelsColor);
          anon_unknown.dwarf_28912e::writeReadYca
                    (fileName._M_dataplus._M_p,dw,WRITE_YC,writeOrder_00,readOrder_00,
                     anon_unknown.dwarf_28912e::fillPixelsColor);
          anon_unknown.dwarf_28912e::writeReadYca
                    (fileName._M_dataplus._M_p,dw,WRITE_YA,writeOrder_00,readOrder_00,
                     anon_unknown.dwarf_28912e::fillPixelsGray);
          anon_unknown.dwarf_28912e::writeReadYca
                    (fileName._M_dataplus._M_p,dw,WRITE_Y,writeOrder_00,readOrder_00,
                     anon_unknown.dwarf_28912e::fillPixelsGray);
        }
      }
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&fileName);
  return;
}

Assistant:

void
testYca (const std::string &tempDir)
{
    try
    {
        cout << "Testing luminance/chroma input and output" << endl;

	std::string fileName = tempDir + "imf_test_yca.exr";

	Box2i dataWindow[6];
	dataWindow[0] = Box2i (V2i (0, 0), V2i (1, 17));
	dataWindow[1] = Box2i (V2i (0, 0), V2i (5, 17));
	dataWindow[2] = Box2i (V2i (0, 0), V2i (17, 1));
	dataWindow[3] = Box2i (V2i (0, 0), V2i (17, 5));
	dataWindow[4] = Box2i (V2i (0, 0), V2i (1, 1));
	dataWindow[5] = Box2i (V2i (-18, -28), V2i (247, 255));

	int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads()? 3: 0;

	for (int n = 0; n <= maxThreads; ++n)
	{
	    if (ILMTHREAD_NAMESPACE::supportsThreads())
	    {
		setGlobalThreadCount (n);
		cout << "\nnumber of threads: " << globalThreadCount() << endl;
	    }

	    for (int i = 0; i < 6; ++i)
	    {
		for (int writeOrder = INCREASING_Y;
		     writeOrder <= DECREASING_Y;
		     ++writeOrder)
		{
		    for (int readOrder = INCREASING_Y;
			 readOrder <= RANDOM_Y;
			 ++readOrder)
		    {
			writeReadYca (fileName.c_str(), dataWindow[i],
				      WRITE_YCA,
				      LineOrder (writeOrder),
				      LineOrder (readOrder),
				      fillPixelsColor);

			writeReadYca (fileName.c_str(), dataWindow[i],
				      WRITE_YC,
				      LineOrder (writeOrder),
				      LineOrder (readOrder),
				      fillPixelsColor);

			writeReadYca (fileName.c_str(), dataWindow[i],
				      WRITE_YA,
				      LineOrder (writeOrder),
				      LineOrder (readOrder),
				      fillPixelsGray);

			writeReadYca (fileName.c_str(), dataWindow[i],
				      WRITE_Y,
				      LineOrder (writeOrder),
				      LineOrder (readOrder),
				      fillPixelsGray);
		    }
		}
	    }
	}

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}